

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void __thiscall xLearn::AUCMetric::Info::~Info(Info *this)

{
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->negative_vec_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

Info() {
      positive_vec_.resize(kMaxBucketSize, 0);
      negative_vec_.resize(kMaxBucketSize, 0);
    }